

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O3

HighsDebugStatus
debugHighsSolution(string *message,HighsOptions *options,HighsLp *lp,HighsHessian *hessian,
                  HighsSolution *solution,HighsBasis *basis,HighsModelStatus model_status,
                  HighsInfo *highs_info,bool check_model_status_and_highs_info)

{
  int iVar1;
  pointer pdVar2;
  pointer pcVar3;
  HighsDebugStatus HVar4;
  uint uVar5;
  long lVar6;
  double dVar7;
  vector<double,_std::allocator<double>_> gradient;
  string local_208;
  double local_1e8;
  string *local_1e0;
  string local_1d8;
  HighsInfo local_highs_info;
  HighsPrimalDualErrors primal_dual_errors;
  
  if ((options->super_HighsOptionsStruct).highs_debug_level < 1) {
    return kNotChecked;
  }
  HighsInfo::HighsInfo(&local_highs_info);
  if ((check_model_status_and_highs_info) &&
     (local_highs_info.super_HighsInfoStruct.objective_function_value = 0.0,
     solution->value_valid == true)) {
    local_1e0 = message;
    local_1e8 = HighsLp::objectiveValue(lp,&solution->col_value);
    dVar7 = HighsHessian::objectiveValue(hessian,&solution->col_value);
    local_highs_info.super_HighsInfoStruct.objective_function_value = local_1e8 + dVar7;
    message = local_1e0;
  }
  gradient.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  gradient.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  gradient.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (hessian->dim_ < 1) {
    local_208._M_dataplus._M_p = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&gradient,(long)lp->num_col_,(value_type_conflict1 *)&local_208);
  }
  else {
    HighsHessian::product(hessian,&solution->col_value,&gradient);
  }
  iVar1 = lp->num_col_;
  if (0 < (long)iVar1) {
    pdVar2 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      gradient.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] =
           pdVar2[lVar6] +
           gradient.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar6];
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  getKktFailures(options,lp,&gradient,solution,basis,&local_highs_info,&primal_dual_errors,true);
  if (!check_model_status_and_highs_info) {
    model_status = kOptimal;
    if (local_highs_info.super_HighsInfoStruct.num_dual_infeasibilities != 0 ||
        local_highs_info.super_HighsInfoStruct.num_primal_infeasibilities != 0) {
      model_status = kMin;
    }
LAB_0025784a:
    pcVar3 = (message->_M_dataplus)._M_p;
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,pcVar3,pcVar3 + message->_M_string_length);
    debugReportHighsSolution
              (&local_1d8,&(options->super_HighsOptionsStruct).log_options,&local_highs_info,
               model_status);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    HVar4 = debugAnalysePrimalDualErrors(options,&primal_dual_errors);
    goto LAB_002578a3;
  }
  HVar4 = debugCompareHighsInfo(options,highs_info,&local_highs_info);
  if (HVar4 != kOk) goto LAB_002578a3;
  if (model_status != kOptimal) goto LAB_0025784a;
  if (local_highs_info.super_HighsInfoStruct.num_primal_infeasibilities < 1) {
    uVar5 = local_highs_info.super_HighsInfoStruct.num_dual_infeasibilities;
    if (local_highs_info.super_HighsInfoStruct.num_dual_infeasibilities < 1) {
      model_status = kOptimal;
      goto LAB_0025784a;
    }
LAB_002578da:
    utilModelStatusToString_abi_cxx11_(&local_208,kOptimal);
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,kError,
                "debugHighsLpSolution: %d dual infeasibilities but model status is %s\n",
                (ulong)uVar5,local_208._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
  }
  else {
    utilModelStatusToString_abi_cxx11_(&local_208,kOptimal);
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,kError,
                "debugHighsLpSolution: %d primal infeasibilities but model status is %s\n",
                (ulong)(uint)local_highs_info.super_HighsInfoStruct.num_primal_infeasibilities,
                local_208._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    uVar5 = local_highs_info.super_HighsInfoStruct.num_dual_infeasibilities;
    if (0 < local_highs_info.super_HighsInfoStruct.num_dual_infeasibilities) goto LAB_002578da;
  }
  HVar4 = kLogicalError;
LAB_002578a3:
  if (gradient.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(gradient.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  HighsInfo::~HighsInfo(&local_highs_info);
  return HVar4;
}

Assistant:

HighsDebugStatus debugHighsSolution(
    const std::string message, const HighsOptions& options, const HighsLp& lp,
    const HighsHessian& hessian, const HighsSolution& solution,
    const HighsBasis& basis, const HighsModelStatus model_status,
    const HighsInfo& highs_info, const bool check_model_status_and_highs_info) {
  // Non-trivially expensive analysis of a solution to a model
  //
  // Called to possibly check the model_status and highs_info,
  // and then report on the KKT and model status, plus any errors
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status;
  // Use local_model_status to for checking - or if it's not known
  HighsModelStatus local_model_status = HighsModelStatus::kNotset;
  // Use local_highs_info to determine highs_info for
  // checking - or if it's not known
  HighsInfo local_highs_info;
  if (check_model_status_and_highs_info) {
    double local_objective_function_value = 0;
    if (solution.value_valid)
      local_objective_function_value =
          lp.objectiveValue(solution.col_value) +
          hessian.objectiveValue(solution.col_value);
    local_highs_info.objective_function_value = local_objective_function_value;
  }
  HighsPrimalDualErrors primal_dual_errors;
  // Determine the extent to which KKT conditions are not satisfied,
  // accumulating data on primal/dual errors relating to any basis
  // implications and excessive residuals
  const bool get_residuals =
      true;  // options.highs_debug_level >= kHighsDebugLevelCostly;

  vector<double> gradient;
  if (hessian.dim_ > 0) {
    hessian.product(solution.col_value, gradient);
  } else {
    gradient.assign(lp.num_col_, 0);
  }
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
    gradient[iCol] += lp.col_cost_[iCol];
  getKktFailures(options, lp, gradient, solution, basis, local_highs_info,
                 primal_dual_errors, get_residuals);
  HighsInt& num_primal_infeasibility =
      local_highs_info.num_primal_infeasibilities;
  HighsInt& num_dual_infeasibility = local_highs_info.num_dual_infeasibilities;
  if (check_model_status_and_highs_info) {
    // Can assume that model_status and highs_info are known, so should be
    // checked
    local_model_status = model_status;
    // Check that highs_info is the same as when computed from scratch
    return_status =
        debugCompareHighsInfo(options, highs_info, local_highs_info);
    if (return_status != HighsDebugStatus::kOk) return return_status;
  } else {
    // Determine whether optimality can be reported
    if (num_primal_infeasibility == 0 && num_dual_infeasibility == 0)
      local_model_status = HighsModelStatus::kOptimal;
  }
  if (check_model_status_and_highs_info &&
      model_status == HighsModelStatus::kOptimal) {
    bool error_found = false;
    if (num_primal_infeasibility > 0) {
      error_found = true;
      highsLogDev(options.log_options, HighsLogType::kError,
                  "debugHighsLpSolution: %" HIGHSINT_FORMAT
                  " primal infeasibilities but model status is %s\n",
                  num_primal_infeasibility,
                  utilModelStatusToString(model_status).c_str());
    }
    if (num_dual_infeasibility > 0) {
      error_found = true;
      highsLogDev(options.log_options, HighsLogType::kError,
                  "debugHighsLpSolution: %" HIGHSINT_FORMAT
                  " dual infeasibilities but model status is %s\n",
                  num_dual_infeasibility,
                  utilModelStatusToString(model_status).c_str());
    }
    if (error_found) return HighsDebugStatus::kLogicalError;
  }
  // Report on the solution
  debugReportHighsSolution(message, options.log_options, local_highs_info,
                           local_model_status);
  // Analyse the primal and dual errors
  return_status = debugAnalysePrimalDualErrors(options, primal_dual_errors);
  return return_status;
}